

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

sherwood_v3_entry<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
* ska::detailv3::
  empty_default_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
            (void)

{
  if (empty_default_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>()
      ::result == '\0') {
    empty_default_table<std::pair<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>
              ();
  }
  return empty_default_table<std::pair<const_slang::ast::Symbol_*,_std::tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>_>_>
         ::result;
}

Assistant:

sherwood_v3_entry<T> * empty_default_table()
{
    static constexpr int8_t special_end_value = 0;
    static sherwood_v3_entry<T> result[min_lookups] = { {}, {}, {}, {special_end_value} };
    return result;
}